

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O3

void Ivy_CutComputeAll(Ivy_Man_t *p,int nInputs)

{
  uint *puVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  int level;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  timespec ts;
  timespec local_48;
  long local_38;
  
  iVar2 = clock_gettime(3,&local_48);
  if (iVar2 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  if (nInputs < 7) {
    iVar2 = p->nObjs[5];
    iVar4 = p->nObjs[6];
    uVar10 = -(iVar2 + iVar4);
    pVVar3 = p->vObjs;
    uVar6 = uVar10;
    if (pVVar3->nSize < 1) {
      uVar8 = 0;
      uVar9 = 0;
    }
    else {
      lVar7 = 0;
      uVar9 = 0;
      uVar8 = 0;
      local_38 = lVar5;
      do {
        puVar1 = (uint *)pVVar3->pArray[lVar7];
        if ((puVar1 != (uint *)0x0) && (0xfffffffd < (puVar1[2] & 0xf) - 7)) {
          Ivy_CutComputeForNode(p,(Ivy_Obj_t *)(ulong)*puVar1,nInputs);
          uVar10 = uVar10 + Ivy_CutComputeForNode::CutStore.nCuts;
          uVar6 = uVar6 + Ivy_CutComputeForNode::CutStore.nCutsM;
          uVar9 = uVar9 + Ivy_CutComputeForNode::CutStore.fSatur;
          uVar8 = uVar8 + 1;
          pVVar3 = p->vObjs;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < pVVar3->nSize);
      iVar2 = p->nObjs[5];
      iVar4 = p->nObjs[6];
      lVar5 = local_38;
    }
    level = 0xa5bfa0;
    printf("All = %6d. Minus = %6d. Triv = %6d.   Node = %6d. Satur = %6d.  ",(ulong)uVar10,
           (ulong)uVar6,(ulong)(uint)(iVar2 + p->nObjs[1] + iVar4),(ulong)uVar8,(ulong)uVar9);
    Abc_Print(level,"%s =","Time");
    iVar4 = 3;
    iVar2 = clock_gettime(3,&local_48);
    if (iVar2 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
    }
    Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar7 + lVar5) / 1000000.0);
  }
  else {
    printf("Cannot compute cuts for more than %d inputs.\n",6);
  }
  return;
}

Assistant:

void Ivy_CutComputeAll( Ivy_Man_t * p, int nInputs )
{
    Ivy_Store_t * pStore;
    Ivy_Obj_t * pObj;
    int i, nCutsTotal, nCutsTotalM, nNodeTotal, nNodeOver;
    abctime clk = Abc_Clock();
    if ( nInputs > IVY_CUT_INPUT )
    {
        printf( "Cannot compute cuts for more than %d inputs.\n", IVY_CUT_INPUT );
        return;
    }
    nNodeTotal = nNodeOver = 0;
    nCutsTotal = nCutsTotalM = -Ivy_ManNodeNum(p);
    Ivy_ManForEachObj( p, pObj, i )
    {
        if ( !Ivy_ObjIsNode(pObj) )
            continue;
        pStore = Ivy_CutComputeForNode( p, pObj, nInputs );
        nCutsTotal  += pStore->nCuts;
        nCutsTotalM += pStore->nCutsM;
        nNodeOver   += pStore->fSatur;
        nNodeTotal++;
    }
    printf( "All = %6d. Minus = %6d. Triv = %6d.   Node = %6d. Satur = %6d.  ", 
        nCutsTotal, nCutsTotalM, Ivy_ManPiNum(p) + Ivy_ManNodeNum(p), nNodeTotal, nNodeOver );
    ABC_PRT( "Time", Abc_Clock() - clk );
}